

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

void __thiscall glTF::Buffer::SEncodedRegion::~SEncodedRegion(SEncodedRegion *this)

{
  if (this->DecodedData != (uint8_t *)0x0) {
    operator_delete__(this->DecodedData);
  }
  std::__cxx11::string::~string((string *)&this->ID);
  return;
}

Assistant:

~SEncodedRegion() { delete [] DecodedData; }